

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O2

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObject(BaseBfbsGenerator *this,Type *type,bool element_type)

{
  BaseType BVar1;
  char *pcVar2;
  Object *pOVar3;
  undefined3 in_register_00000011;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  int __c_00;
  Type *pTVar4;
  
  pTVar4 = type;
  if (CONCAT31(in_register_00000011,element_type) == 0) {
    BVar1 = reflection::Type::base_type(type);
    __c = extraout_EDX_00;
  }
  else {
    BVar1 = reflection::Type::element(type);
    __c = extraout_EDX;
  }
  pcVar2 = reflection::Type::index(type,(char *)pTVar4,__c);
  if ((BVar1 == Obj) && (-1 < (int)pcVar2)) {
    pcVar2 = reflection::Type::index(type,(char *)pTVar4,__c_00);
    pOVar3 = GetObjectByIndex(this,(int32_t)pcVar2);
    return pOVar3;
  }
  return (Object *)0x0;
}

Assistant:

const reflection::Object *GetObject(const reflection::Type *type,
                                      bool element_type = false) const {
    const reflection::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (type->index() >= 0 && IsStructOrTable(base_type)) {
      return GetObjectByIndex(type->index());
    }
    return nullptr;
  }